

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::FrameBegin
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          WindowInputExpression *boundary_begin,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  long lVar1;
  undefined1 *order_begin;
  __node_base_ptr p_Var2;
  idx_t iVar3;
  _Hash_node_base *order_end;
  WindowInputExpression *this_00;
  bool bVar4;
  idx_t chunk_idx_3;
  reference pvVar5;
  reference pvVar6;
  long lVar7;
  unsigned_long uVar8;
  idx_t iVar9;
  idx_t iVar10;
  WindowCursor *pWVar11;
  type pWVar12;
  OutOfRangeException *pOVar13;
  InternalException *this_01;
  idx_t *piVar14;
  idx_t *piVar15;
  idx_t chunk_idx;
  undefined1 *puVar16;
  idx_t chunk_idx_1;
  allocator local_b9;
  FrameBounds *local_b8;
  idx_t *local_b0;
  idx_t *local_a8;
  idx_t *local_a0;
  idx_t local_98;
  WindowInputExpression *local_90;
  optional_ptr<duckdb::WindowCursor,_true> *local_88;
  idx_t local_80;
  unsigned_long n;
  optional_ptr<duckdb::WindowCursor,_true> *local_58;
  idx_t *local_50;
  idx_t *local_48;
  __node_base_ptr local_40;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_38;
  
  local_b8 = (FrameBounds *)order_mask;
  local_98 = row_idx;
  local_90 = boundary_begin;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,0);
  local_a0 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,1);
  local_48 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,2);
  piVar15 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,4);
  piVar14 = (idx_t *)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,5);
  p_Var2 = (__node_base_ptr)pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
  local_b0 = (idx_t *)pvVar5->data;
  local_80 = *local_a0;
  (this->prev).start = *piVar14;
  (this->prev).end = (idx_t)p_Var2->_M_nxt;
  local_a8 = piVar15;
  local_50 = piVar14;
  local_40 = p_Var2;
  if (((this->has_preceding_range != false) || (this->has_following_range == true)) &&
     ((this->range_lo).ptr != range.ptr)) {
    (this->range_lo).ptr = range.ptr;
    optional_ptr<duckdb::WindowCursor,_true>::operator->(&this->range_lo);
    WindowCursor::Copy((WindowCursor *)&n);
    uVar8 = n;
    n = 0;
    ::std::__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::reset
              ((__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &this->range_hi,(pointer)uVar8);
    piVar15 = local_a8;
    ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)&n);
  }
  this_00 = local_90;
  piVar14 = local_b0;
  if (this->start_boundary < (EXPR_FOLLOWING_RANGE|CURRENT_ROW_ROWS)) {
    local_88 = (optional_ptr<duckdb::WindowCursor,_true> *)count;
    switch(this->start_boundary) {
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&n,"Unsupported window start boundary",&local_b9);
      InternalException::InternalException(this_01,(string *)&n);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case UNBOUNDED_PRECEDING:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,0);
      Vector::Reference(pvVar5,pvVar6);
      return;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,2);
      Vector::Reference(pvVar5,pvVar6);
      piVar14 = piVar15;
      break;
    case CURRENT_ROW_ROWS:
      for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
        local_b0[iVar9] = local_98 + iVar9;
      }
      break;
    case EXPR_PRECEDING_ROWS:
      for (iVar9 = 0; piVar14 = local_b0, count != iVar9; iVar9 = iVar9 + 1) {
        lVar1 = local_98 + iVar9;
        lVar7 = WindowInputExpression::GetCell<long>(this_00,iVar9);
        bVar4 = TrySubtractOperator::Operation<long,long,long>(lVar1,lVar7,(int64_t *)&n);
        if (bVar4) {
          iVar10 = n;
          if ((long)n < 1) {
            iVar10 = 0;
          }
        }
        else {
          iVar10 = local_a0[iVar9];
        }
        local_b0[iVar9] = iVar10;
      }
      break;
    case EXPR_FOLLOWING_ROWS:
      for (iVar9 = 0; piVar14 = local_b0, count != iVar9; iVar9 = iVar9 + 1) {
        lVar1 = local_98 + iVar9;
        lVar7 = WindowInputExpression::GetCell<long>(this_00,iVar9);
        bVar4 = TryAddOperator::Operation<long,long,long>(lVar1,lVar7,(int64_t *)&n);
        if (bVar4) {
          iVar10 = n;
          if ((long)n < 1) {
            iVar10 = 0;
          }
        }
        else {
          iVar10 = local_a0[iVar9];
        }
        local_b0[iVar9] = iVar10;
      }
      break;
    case EXPR_PRECEDING_RANGE:
      local_88 = &this->range_lo;
      local_58 = (optional_ptr<duckdb::WindowCursor,_true> *)&this->range_hi;
      local_b8 = &this->prev;
      for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,iVar9);
        if (bVar4) {
          iVar10 = piVar15[iVar9];
          local_98 = local_98 + 1;
        }
        else {
          iVar10 = local_50[iVar9];
          (this->prev).end = (idx_t)local_40[iVar9]._M_nxt;
          iVar3 = local_a0[iVar9];
          if (iVar3 != local_80) {
            local_b8->start = iVar10;
            local_80 = iVar3;
          }
          pWVar11 = optional_ptr<duckdb::WindowCursor,_true>::operator*(local_88);
          pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                                 *)local_58);
          local_98 = local_98 + 1;
          iVar10 = FindOrderedRangeBound<true>
                             (pWVar11,pWVar12,this->range_sense,iVar10,local_98,this->start_boundary
                              ,this_00,iVar9,local_b8);
          (this->prev).start = iVar10;
          piVar14 = local_b0;
          piVar15 = local_a8;
        }
        piVar14[iVar9] = iVar10;
      }
      break;
    case EXPR_FOLLOWING_RANGE:
      local_58 = &this->range_lo;
      local_38 = &this->range_hi;
      local_b8 = &this->prev;
      for (puVar16 = (undefined1 *)0x0; (undefined1 *)count != puVar16; puVar16 = puVar16 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,(idx_t)puVar16);
        if (bVar4) {
          iVar9 = piVar15[(long)puVar16];
        }
        else {
          order_end = local_40[(long)puVar16]._M_nxt;
          (this->prev).end = (idx_t)order_end;
          iVar9 = local_a0[(long)puVar16];
          if (iVar9 != local_80) {
            local_b8->start = local_50[(long)puVar16];
            local_80 = iVar9;
          }
          order_begin = puVar16 + local_98;
          pWVar11 = optional_ptr<duckdb::WindowCursor,_true>::operator*(local_58);
          pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*(local_38);
          iVar9 = FindOrderedRangeBound<true>
                            (pWVar11,pWVar12,this->range_sense,(idx_t)order_begin,(idx_t)order_end,
                             this->start_boundary,this_00,(idx_t)puVar16,local_b8);
          (this->prev).start = iVar9;
          piVar14 = local_b0;
          count = (idx_t)local_88;
          piVar15 = local_a8;
        }
        piVar14[(long)puVar16] = iVar9;
      }
      break;
    case EXPR_PRECEDING_GROUPS:
      for (puVar16 = (undefined1 *)0x0; count = (idx_t)local_88,
          local_88 != (optional_ptr<duckdb::WindowCursor,_true> *)puVar16; puVar16 = puVar16 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,(idx_t)puVar16);
        iVar9 = piVar15[(long)puVar16];
        if (!bVar4) {
          iVar10 = local_a0[(long)puVar16];
          uVar8 = WindowInputExpression::GetCell<long>(this_00,(idx_t)puVar16);
          if ((long)uVar8 < 0) {
            pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string((string *)&n,"Invalid GROUPS PRECEDING value",&local_b9);
            OutOfRangeException::OutOfRangeException(pOVar13,(string *)&n);
            __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          piVar15 = local_a8;
          if (uVar8 != 0) {
            n = uVar8;
            iVar9 = FindPrevStart((ValidityMask *)local_b8,iVar10,iVar9,&n);
            piVar15 = local_a8;
          }
        }
        piVar14[(long)puVar16] = iVar9;
      }
      break;
    case EXPR_FOLLOWING_GROUPS:
      for (puVar16 = (undefined1 *)0x0; count = (idx_t)local_88,
          local_88 != (optional_ptr<duckdb::WindowCursor,_true> *)puVar16; puVar16 = puVar16 + 1) {
        bVar4 = WindowInputExpression::CellIsNull(this_00,(idx_t)puVar16);
        iVar9 = piVar15[(long)puVar16];
        if (!bVar4) {
          iVar10 = local_48[(long)puVar16];
          uVar8 = WindowInputExpression::GetCell<long>(this_00,(idx_t)puVar16);
          if ((long)uVar8 < 0) {
            pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string((string *)&n,"Invalid GROUPS FOLLOWING value",&local_b9);
            OutOfRangeException::OutOfRangeException(pOVar13,(string *)&n);
            __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          piVar15 = local_a8;
          if (uVar8 != 0) {
            n = uVar8;
            iVar9 = FindNextStart((ValidityMask *)local_b8,iVar9 + 1,iVar10,&n);
            piVar15 = local_a8;
          }
        }
        piVar14[(long)puVar16] = iVar9;
      }
    }
  }
  ClampFrame(count,piVar14,local_a0,local_48);
  return;
}

Assistant:

void WindowBoundariesState::FrameBegin(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                       WindowInputExpression &boundary_begin, const ValidityMask &order_mask,
                                       optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_END]);
	auto peer_begin_data = FlatVector::GetData<idx_t>(bounds.data[PEER_BEGIN]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_END]);
	auto frame_begin_data = FlatVector::GetData<idx_t>(bounds.data[FRAME_BEGIN]);

	idx_t window_start = NumericLimits<idx_t>::Maximum();

	//	Reset previous range hints
	idx_t prev_partition = partition_begin_data[0];
	prev.start = valid_begin_data[0];
	prev.end = valid_end_data[0];

	if (has_preceding_range || has_following_range) {
		if (range_lo.get() != range.get()) {
			range_lo = range.get();
			range_hi = range_lo->Copy();
		}
	}

	switch (start_boundary) {
	case WindowBoundary::UNBOUNDED_PRECEDING:
		bounds.data[FRAME_BEGIN].Reference(bounds.data[PARTITION_BEGIN]);
		// No need to clamp
		return;
	case WindowBoundary::CURRENT_ROW_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			frame_begin_data[chunk_idx] = row_idx;
		}
		break;
	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::CURRENT_ROW_GROUPS:
		// in RANGE or GROUPS mode it means that the frame starts or ends with the current row's
		// first or last peer in the ORDER BY ordering
		bounds.data[FRAME_BEGIN].Reference(bounds.data[PEER_BEGIN]);
		frame_begin_data = peer_begin_data;
		break;
	case WindowBoundary::EXPR_PRECEDING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TrySubtractOperator::Operation(static_cast<int64_t>(row_idx),
			                                    boundary_begin.GetCell<int64_t>(chunk_idx), computed_start)) {
				window_start = partition_begin_data[chunk_idx];
			} else {
				window_start = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TryAddOperator::Operation(static_cast<int64_t>(row_idx), boundary_begin.GetCell<int64_t>(chunk_idx),
			                               computed_start)) {
				window_start = partition_begin_data[chunk_idx];
			} else {
				window_start = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				const auto valid_start = valid_begin_data[chunk_idx];
				prev.end = valid_end_data[chunk_idx];
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.start = valid_start;
					prev_partition = cur_partition;
				}
				window_start = FindOrderedRangeBound<true>(*range_lo, *range_hi, range_sense, valid_start, row_idx + 1,
				                                           start_boundary, boundary_begin, chunk_idx, prev);
				prev.start = window_start;
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				const auto valid_end = valid_end_data[chunk_idx];
				prev.end = valid_end;
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.start = valid_begin_data[chunk_idx];
					prev_partition = cur_partition;
				}
				window_start = FindOrderedRangeBound<true>(*range_lo, *range_hi, range_sense, row_idx, valid_end,
				                                           start_boundary, boundary_begin, chunk_idx, prev);
				prev.start = window_start;
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
		// In GROUPS mode, the offset is an integer indicating that the frame starts or ends that many peer groups
		// before or after the current row's peer group, where a peer group is a group of rows that are equivalent
		// according to the window's ORDER BY clause.
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				//	Count peer groups backwards.
				const auto peer_begin = peer_begin_data[chunk_idx];
				const auto partition_begin = partition_begin_data[chunk_idx];
				const auto boundary = boundary_begin.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS PRECEDING value");
				} else if (!boundary) {
					window_start = peer_begin;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_start = FindPrevStart(order_mask, partition_begin, peer_begin, n);
				}
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_begin.CellIsNull(chunk_idx)) {
				window_start = peer_begin_data[chunk_idx];
			} else {
				//	Count peer groups forward.
				const auto peer_begin = peer_begin_data[chunk_idx];
				const auto partition_end = partition_end_data[chunk_idx];
				const auto boundary = boundary_begin.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS FOLLOWING value");
				} else if (!boundary) {
					window_start = peer_begin;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_start = FindNextStart(order_mask, peer_begin + 1, partition_end, n);
				}
			}
			frame_begin_data[chunk_idx] = window_start;
		}
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
	case WindowBoundary::INVALID:
		throw InternalException("Unsupported window start boundary");
	}

	ClampFrame(count, frame_begin_data, partition_begin_data, partition_end_data);
}